

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::SetAllPropertiesToUndefined
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance,bool invalidateFixedFields)

{
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar1;
  ScriptContext *scriptContext;
  JavascriptString *propertyKey;
  RecyclableObject *value;
  JavascriptString **ppJVar2;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  undefined7 in_register_00000011;
  int iVar3;
  int iVar4;
  
  if (((int)CONCAT71(in_register_00000011,invalidateFixedFields) != 0) &&
     (pBVar1 = (this->propertyMap).ptr, iVar4 = pBVar1->count - pBVar1->freeCount, 0 < iVar4)) {
    scriptContext =
         (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr;
    iVar3 = 0;
    do {
      ppJVar2 = JsUtil::
                BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                ::GetKeyAt((this->propertyMap).ptr,iVar3);
      propertyKey = *ppJVar2;
      descriptor = JsUtil::
                   BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                   ::GetReferenceAt((this->propertyMap).ptr,iVar3);
      SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
      InvalidateFixedField<Js::JavascriptString*>
                ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this,
                 propertyKey,descriptor,scriptContext);
      iVar3 = iVar3 + 1;
    } while (iVar4 != iVar3);
  }
  iVar4 = this->nextPropertyIndex;
  if (0 < iVar4) {
    value = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).undefinedValue.ptr;
    iVar3 = 0;
    do {
      DynamicTypeHandler::SetSlotUnchecked(instance,iVar3,value);
      iVar3 = iVar3 + 1;
    } while (iVar4 != iVar3);
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetAllPropertiesToUndefined(DynamicObject* instance, bool invalidateFixedFields)
    {
        // Note: This method is currently only called from ResetObject, which in turn only applies to external objects.
        // Before using for other purposes, make sure the assumptions made here make sense in the new context.  In particular,
        // the invalidateFixedFields == false is only correct if a) the object is known not to have any, or b) the type of the
        // object has changed and/or property guards have already been invalidated through some other means.

        if (IsNotExtensibleSupported)
        {
            // The Var for window is reused across navigation. we shouldn't preserve the IsExtensibleFlag when we don't keep
            // the expandos. Reset the IsExtensibleFlag in cleanup scenario should be good enough
            // to cover all the preventExtension/Freeze/Seal scenarios.
            ChangeFlags(IsExtensibleFlag | IsSealedOnceFlag | IsFrozenOnceFlag, IsExtensibleFlag);
        }

#if ENABLE_FIXED_FIELDS
        int propertyCount = this->propertyMap->Count();
        if (invalidateFixedFields)
        {
            Js::ScriptContext* scriptContext = instance->GetScriptContext();
            for (int propertyIndex = 0; propertyIndex < propertyCount; propertyIndex++)
            {
                const TMapKey propertyRecord = this->propertyMap->GetKeyAt(propertyIndex);
                SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor = this->propertyMap->GetReferenceAt(propertyIndex);
                InvalidateFixedField(propertyRecord, descriptor, scriptContext);
            }
        }
#endif

        Js::RecyclableObject* undefined = instance->GetLibrary()->GetUndefined();
        int slotCount = this->nextPropertyIndex;
        for (int slotIndex = 0; slotIndex < slotCount; slotIndex++)
        {
            SetSlotUnchecked(instance, slotIndex, undefined);
        }
    }